

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_lexer.yy.cc
# Opt level: O3

void __thiscall yyFlexLexer::yyunput(yyFlexLexer *this,int c,char *yy_bp)

{
  char *pcVar1;
  yy_buffer_state *pyVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  char *pcVar7;
  
  pcVar7 = this->yy_c_buf_p;
  *pcVar7 = this->yy_hold_char;
  pyVar2 = this->yy_buffer_stack[this->yy_buffer_stack_top];
  pcVar1 = pyVar2->yy_ch_buf;
  if (pcVar7 < pcVar1 + 2) {
    iVar6 = pyVar2->yy_buf_size;
    pcVar4 = pcVar1 + (long)iVar6 + 2;
    pcVar5 = pcVar1 + (long)this->yy_n_chars + 2;
    if (pcVar1 < pcVar5) {
      do {
        pcVar1 = pcVar5 + -1;
        pcVar5 = pcVar5 + -1;
        pcVar4[-1] = *pcVar1;
        pcVar4 = pcVar4 + -1;
        pyVar2 = this->yy_buffer_stack[this->yy_buffer_stack_top];
        pcVar1 = pyVar2->yy_ch_buf;
      } while (pcVar1 < pcVar5);
      iVar6 = pyVar2->yy_buf_size;
    }
    iVar3 = (int)pcVar4 - (int)pcVar5;
    pcVar7 = pcVar7 + iVar3;
    yy_bp = yy_bp + iVar3;
    this->yy_n_chars = iVar6;
    pyVar2->yy_n_chars = iVar6;
    if (pcVar7 < pcVar1 + 2) {
      (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])(this,"flex scanner push-back overflow");
    }
  }
  pcVar7[-1] = (char)c;
  (this->super_FlexLexer).yytext = yy_bp;
  this->yy_hold_char = pcVar7[-1];
  this->yy_c_buf_p = pcVar7 + -1;
  return;
}

Assistant:

void yyFlexLexer::yyunput( int c, char* yy_bp)
/* %endif */
{
	char *yy_cp;
    
    yy_cp = (yy_c_buf_p);

	/* undo effects of setting up yytext */
	*yy_cp = (yy_hold_char);

	if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
		{ /* need to shift things up to make room */
		/* +2 for EOB chars. */
		int number_to_move = (yy_n_chars) + 2;
		char *dest = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[
					YY_CURRENT_BUFFER_LVALUE->yy_buf_size + 2];
		char *source =
				&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move];

		while ( source > YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			*--dest = *--source;

		yy_cp += (int) (dest - source);
		yy_bp += (int) (dest - source);
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars =
			(yy_n_chars) = (int) YY_CURRENT_BUFFER_LVALUE->yy_buf_size;

		if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
			YY_FATAL_ERROR( "flex scanner push-back overflow" );
		}

	*--yy_cp = (char) c;

/* %% [18.0] update yylineno here */

	(yytext_ptr) = yy_bp;
	(yy_hold_char) = *yy_cp;
	(yy_c_buf_p) = yy_cp;
}